

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O0

bool __thiscall
GmmLib::Table::TrackTableUsage
          (Table *this,TT_TYPE Type,bool IsL1,GMM_GFX_ADDRESS TileAdr,bool NullMapped,
          GMM_LIB_CONTEXT *pGmmLibContext)

{
  uint uVar1;
  WA_TABLE *pWVar2;
  byte bVar3;
  int iVar4;
  uint local_6c;
  uint local_68;
  int local_64;
  int local_4c;
  int i;
  int TableDWSize;
  uint32_t BitNum;
  uint32_t ElemNum;
  uint32_t EntryIdx;
  GMM_LIB_CONTEXT *pGmmLibContext_local;
  bool NullMapped_local;
  GMM_GFX_ADDRESS TileAdr_local;
  bool IsL1_local;
  TT_TYPE Type_local;
  Table *this_local;
  
  if (IsL1) {
    pWVar2 = Context::GetWaTable(pGmmLibContext);
    if ((*(ulong *)&pWVar2->field_0x4 >> 0x2e & 1) == 0) {
      pWVar2 = Context::GetWaTable(pGmmLibContext);
      local_64 = 0x40;
      if (((uint)((ulong)*(undefined8 *)&pWVar2->field_0x4 >> 0x2f) & 1) != 0) {
        local_64 = 4;
      }
    }
    else {
      local_64 = 1;
    }
    local_68 = (uint)(((TileAdr & 0xffc000) >> 0xe) / (ulong)(long)local_64);
  }
  else {
    local_68 = (uint)(TileAdr >> 0x18) & 0xfff;
  }
  uVar1 = local_68 >> 5;
  bVar3 = (byte)local_68 & 0x1f;
  if (NullMapped) {
    this->UsedEntries[uVar1] = (1 << bVar3 ^ 0xffffffffU) & this->UsedEntries[uVar1];
    if (IsL1) {
      pWVar2 = Context::GetWaTable(pGmmLibContext);
      iVar4 = 4;
      if (((uint)((ulong)*(undefined8 *)&pWVar2->field_0x4 >> 0x2e) & 1) != 0) {
        iVar4 = 1;
      }
      local_6c = ((int)(0x400 / (ulong)(long)iVar4) + 0x1fU) / 0x20;
    }
    else {
      local_6c = 0x80;
    }
    for (local_4c = 0; local_4c < (int)local_6c; local_4c = local_4c + 1) {
      if (this->UsedEntries[local_4c] != 0) {
        return false;
      }
    }
  }
  else {
    this->UsedEntries[uVar1] = 1 << bVar3 | this->UsedEntries[uVar1];
  }
  return (bool)(-NullMapped & 1);
}

Assistant:

bool GmmLib::Table::TrackTableUsage(TT_TYPE Type, bool IsL1, GMM_GFX_ADDRESS TileAdr, bool NullMapped, GMM_LIB_CONTEXT *pGmmLibContext )
{
    uint32_t EntryIdx;
    uint32_t ElemNum = 0, BitNum = 0;

    EntryIdx = IsL1 ? static_cast<uint32_t>(GMM_L1_ENTRY_IDX(Type, TileAdr, pGmmLibContext)) : static_cast<uint32_t>(GMM_L2_ENTRY_IDX(Type, TileAdr));

    ElemNum = EntryIdx / (sizeof(UsedEntries[0]) * 8);
    BitNum  = EntryIdx % (sizeof(UsedEntries[0]) * 8);

    if(NullMapped)
    {
        UsedEntries[ElemNum] &= ~(1 << BitNum);
    }
    else
    {
        UsedEntries[ElemNum] |= (1 << BitNum);
    }

    if(NullMapped)
    {
        int TableDWSize = IsL1 ? static_cast<int>(GMM_L1_SIZE_DWORD(Type,  pGmmLibContext)) : static_cast<int>(GMM_L2_SIZE_DWORD(Type));
        for(int i = 0; i < TableDWSize; i++)
        {
            if(UsedEntries[i])
            {
                return false;
            }
        }
    }
    return NullMapped ? true : false;
}